

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O2

void __thiscall Fl_Pixmap::delete_data(Fl_Pixmap *this)

{
  char **ppcVar1;
  int i;
  long lVar2;
  
  if (this->alloc_data != 0) {
    for (lVar2 = 0; ppcVar1 = (this->super_Fl_Image).data_, lVar2 < (this->super_Fl_Image).count_;
        lVar2 = lVar2 + 1) {
      if (ppcVar1[lVar2] != (char *)0x0) {
        operator_delete__(ppcVar1[lVar2]);
      }
    }
    if (ppcVar1 != (char **)0x0) {
      operator_delete__(ppcVar1);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Pixmap::delete_data() {
  if (alloc_data) {
    for (int i = 0; i < count(); i ++) delete[] (char *)data()[i];
    delete[] (char **)data();
  }
}